

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::MessageDifferencerTest_RepeatedFieldTreatmentChangeListToSet_Test
::TestBody(MessageDifferencerTest_RepeatedFieldTreatmentChangeListToSet_Test *this)

{
  FieldDescriptor *pFVar1;
  char *in_R9;
  string_view name;
  string_view name_00;
  Metadata MVar2;
  TestDiffMessage msg2;
  TestDiffMessage msg1;
  MessageDifferencer differencer;
  AssertHelper local_370;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_368;
  internal local_360 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_358;
  string local_350;
  undefined1 local_330 [184];
  undefined1 local_278 [184];
  MessageDifferencer local_1c0;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_278,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage((TestDiffMessage *)local_330,(Arena *)0x0);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_278 + 0x60),1);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_278 + 0x60),2);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_330 + 0x60),2);
  RepeatedField<int>::Add((RepeatedField<int> *)(local_330 + 0x60),1);
  util::MessageDifferencer::MessageDifferencer(&local_1c0);
  MVar2 = proto2_unittest::TestDiffMessage::GetMetadata
                    ((TestDiffMessage *)proto2_unittest::_TestDiffMessage_default_instance_);
  name._M_str = "rv";
  name._M_len = 2;
  pFVar1 = Descriptor::FindFieldByName(MVar2.descriptor,name);
  util::MessageDifferencer::TreatAsList(&local_1c0,pFVar1);
  MVar2 = proto2_unittest::TestDiffMessage::GetMetadata
                    ((TestDiffMessage *)proto2_unittest::_TestDiffMessage_default_instance_);
  name_00._M_str = "rv";
  name_00._M_len = 2;
  pFVar1 = Descriptor::FindFieldByName(MVar2.descriptor,name_00);
  util::MessageDifferencer::TreatAsSet(&local_1c0,pFVar1);
  local_360[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c0,(Message *)local_278,(Message *)local_330);
  local_358 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_360[0]) {
    testing::Message::Message((Message *)&local_368);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_350,local_360,(AssertionResult *)0x122213d,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_370,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x5e0,local_350._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_368);
    testing::internal::AssertHelper::~AssertHelper(&local_370);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_368._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_368._M_head_impl + 8))();
    }
    if (local_358 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_358,local_358);
    }
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c0);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_330);
  proto2_unittest::TestDiffMessage::~TestDiffMessage((TestDiffMessage *)local_278);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldTreatmentChangeListToSet) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;

  msg1.add_rv(1);
  msg1.add_rv(2);
  msg2.add_rv(2);
  msg2.add_rv(1);

  util::MessageDifferencer differencer;
  differencer.TreatAsList(
      proto2_unittest::TestDiffMessage::descriptor()->FindFieldByName("rv"));
  differencer.TreatAsSet(
      proto2_unittest::TestDiffMessage::descriptor()->FindFieldByName("rv"));

  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}